

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O3

Gia_Man_t * Bmc_CexTargetEnlarge(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  int iVar12;
  Vec_Int_t *pVVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  bool bVar24;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  if (nFrames < 1) {
    uVar5 = p->nRegs;
  }
  else {
    uVar5 = p->nRegs;
    pVVar13 = p->vCis;
    iVar23 = 0;
    do {
      iVar17 = pVVar13->nSize;
      if ((int)uVar5 < iVar17) {
        lVar15 = 0;
        do {
          if (iVar17 <= lVar15) goto LAB_00522b18;
          if ((pVVar13->pArray[lVar15] < 0) || (p->nObjs <= pVVar13->pArray[lVar15]))
          goto LAB_00522af9;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar8 = Gia_ManAppendObj(p_00);
          uVar16 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 = uVar16 | 0x9fffffff;
          *(ulong *)pGVar8 =
               uVar16 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar3 = p_00->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00522b37;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar8)) goto LAB_00522b37;
          lVar15 = lVar15 + 1;
          uVar5 = p->nRegs;
          pVVar13 = p->vCis;
          iVar17 = pVVar13->nSize;
        } while (lVar15 < (int)(iVar17 - uVar5));
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 != nFrames);
  }
  if (0 < (int)uVar5) {
    iVar23 = 0;
    do {
      iVar17 = p->vCis->nSize;
      uVar14 = (iVar17 - uVar5) + iVar23;
      if (((int)uVar14 < 0) || (iVar17 <= (int)uVar14)) goto LAB_00522b18;
      iVar17 = p->vCis->pArray[uVar14];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00522af9;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p_00->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) {
LAB_00522b37:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_00->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_00522b37;
      pGVar3[iVar17].Value = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
      iVar23 = iVar23 + 1;
      uVar5 = p->nRegs;
    } while (iVar23 < (int)uVar5);
  }
  if (0 < nFrames) {
    iVar12 = 0;
    iVar23 = nFrames;
    iVar17 = nFrames;
    do {
      iVar23 = iVar23 + -1;
      iVar17 = iVar17 + -1;
      pVVar13 = p->vCis;
      uVar14 = pVVar13->nSize;
      uVar11 = uVar14 - uVar5;
      if (uVar11 == 0 || (int)uVar14 < (int)uVar5) {
        uVar14 = p->nObjs;
        if (0 < (int)uVar14) goto LAB_00522860;
      }
      else {
        uVar16 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar16 = 0;
        }
        lVar15 = (long)(int)(uVar11 * iVar23);
        uVar20 = 0;
        do {
          bVar24 = uVar16 == 0;
          uVar16 = uVar16 - 1;
          if (bVar24) goto LAB_00522b18;
          iVar4 = pVVar13->pArray[uVar20];
          if (((long)iVar4 < 0) || (uVar14 = p->nObjs, (int)uVar14 <= iVar4)) goto LAB_00522af9;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (((int)(iVar17 * uVar11) < 0) || (p_00->vCis->nSize <= lVar15)) goto LAB_00522b18;
          iVar19 = p_00->vCis->pArray[lVar15];
          if (((long)iVar19 < 0) || (p_00->nObjs <= iVar19)) goto LAB_00522af9;
          pGVar3 = p_00->pObjs;
          pGVar8 = (Gia_Obj_t *)((ulong)(pGVar3 + iVar19) & 0xfffffffffffffffe);
          if ((pGVar8 < pGVar3) || (pGVar3 + (uint)p_00->nObjs <= pGVar8)) goto LAB_00522b37;
          iVar21 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2);
          if (iVar21 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          p->pObjs[iVar4].Value = ((uint)(pGVar3 + iVar19) & 1) + iVar21 * 0x55555556;
          uVar20 = uVar20 + 1;
          lVar15 = lVar15 + 1;
        } while (uVar11 != uVar20);
LAB_00522860:
        lVar22 = 8;
        lVar15 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)((long)pGVar3 + lVar22 + -8);
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            uVar5 = *(uint *)((long)pGVar3 +
                             lVar22 + (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3);
            if (((int)uVar5 < 0) ||
               (uVar14 = *(uint *)((long)pGVar3 +
                                  lVar22 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar14 < 0)) goto LAB_00522b56;
            iVar4 = Gia_ManHashAnd(p_00,uVar5 ^ (uint)(uVar16 >> 0x1d) & 1,
                                   uVar14 ^ (uint)(uVar16 >> 0x3d) & 1);
            *(int *)(&pGVar3->field_0x0 + lVar22) = iVar4;
            uVar14 = p->nObjs;
          }
          lVar15 = lVar15 + 1;
          lVar22 = lVar22 + 0xc;
        } while (lVar15 < (int)uVar14);
        uVar5 = p->nRegs;
      }
      if (0 < (int)uVar5) {
        pVVar13 = p->vCos;
        iVar4 = pVVar13->nSize;
        uVar18 = (ulong)(iVar4 - uVar5);
        uVar20 = (ulong)uVar5;
        uVar16 = uVar20;
        do {
          if (((int)uVar18 < 0) || (iVar4 <= (int)uVar18)) goto LAB_00522b18;
          iVar19 = pVVar13->pArray[uVar18];
          if (((long)iVar19 < 0) || ((int)uVar14 <= iVar19)) goto LAB_00522af9;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar19;
          if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
          goto LAB_00522b56;
          pGVar3->Value =
               (uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
               pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value;
          uVar18 = uVar18 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        if (0 < (int)uVar5) {
          pVVar13 = p->vCos;
          iVar4 = pVVar13->nSize;
          uVar16 = (ulong)(iVar4 - uVar5);
          iVar19 = -uVar5;
          do {
            if ((iVar4 + iVar19 < 0) || (iVar4 <= iVar4 + iVar19)) goto LAB_00522b18;
            iVar21 = pVVar13->pArray[uVar16];
            if (((long)iVar21 < 0) || ((int)uVar14 <= iVar21)) goto LAB_00522af9;
            pGVar3 = p->pObjs;
            if (pGVar3 == (Gia_Obj_t *)0x0) break;
            iVar1 = p->vCis->nSize;
            uVar11 = iVar19 + iVar1;
            if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) goto LAB_00522b18;
            uVar11 = p->vCis->pArray[uVar11];
            if (((long)(int)uVar11 < 0) || (uVar14 <= uVar11)) goto LAB_00522af9;
            pGVar3[(int)uVar11].Value = pGVar3[iVar21].Value;
            iVar19 = iVar19 + 1;
            uVar16 = uVar16 + 1;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != nFrames);
  }
  iVar23 = p->vCos->nSize;
  if (iVar23 <= (int)uVar5) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (0 < iVar23) {
    iVar23 = *p->vCos->pArray;
    if ((-1 < (long)iVar23) && (iVar23 < p->nObjs)) {
      pGVar3 = p->pObjs + iVar23;
      if (-1 < (int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value) {
        uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                     pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                     Value);
        pGVar3->Value = uVar5;
        Gia_ManHashStop(p_00);
        pGVar10 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar10;
      }
LAB_00522b56:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf5,"int Abc_LitNotCond(int, int)");
    }
LAB_00522af9:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_00522b18:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexTargetEnlarge( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( k = 0; k < nFrames; k++ )
        Gia_ManForEachPi( p, pObj, i )
            Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( k = 0; k < nFrames; k++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, (nFrames - 1 - k) * Gia_ManPiNum(p) + i );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value  = pObj->Value;
    }
    pObj = Gia_ManPo( p, 0 );
    pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}